

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddRuntimeLinkLibrary(cmComputeLinkInformation *this,string *lang)

{
  cmMakefile *this_00;
  bool bVar1;
  cmValue cVar2;
  _Alloc_hider key;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libsVec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  LinkEntry local_c0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60;
  
  cmGeneratorTarget::GetRuntimeLinkLibrary(&local_e0,this->Target,lang,&this->Config);
  if (local_e0._M_string_length != 0) {
    this_00 = this->Makefile;
    std::operator+(&local_100,"CMAKE_",lang);
    std::operator+(&local_158,&local_100,"_RUNTIME_LIBRARY_LINK_OPTIONS_");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                   &local_158,&local_e0);
    cVar2 = cmMakefile::GetDefinition(this_00,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_100);
    if (cVar2.Value != (string *)0x0) {
      arg._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar2.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_158,arg,false);
      for (key._M_p = local_158._M_dataplus._M_p; key._M_p != (pointer)local_158._M_string_length;
          key._M_p = key._M_p + 0x20) {
        bVar1 = ::cm::
                contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&this->ImplicitLinkLibs,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           key._M_p);
        if (!bVar1) {
          std::__cxx11::string::string((string *)&local_120,(string *)key._M_p);
          local_138.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_138.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_138);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                    (&local_60,&local_120,(cmListFileBacktrace *)&local_138);
          cmComputeLinkDepends::LinkEntry::LinkEntry(&local_c0,&local_60,(cmGeneratorTarget *)0x0);
          AddItem(this,&local_c0);
          cmComputeLinkDepends::LinkEntry::~LinkEntry(&local_c0);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                    (&local_60);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_138.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::__cxx11::string::~string((string *)&local_120);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_158);
    }
  }
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

void cmComputeLinkInformation::AddRuntimeLinkLibrary(std::string const& lang)
{
  std::string const& runtimeLibrary =
    this->Target->GetRuntimeLinkLibrary(lang, this->Config);
  if (runtimeLibrary.empty()) {
    return;
  }
  if (cmValue runtimeLinkOptions = this->Makefile->GetDefinition(
        "CMAKE_" + lang + "_RUNTIME_LIBRARY_LINK_OPTIONS_" + runtimeLibrary)) {
    std::vector<std::string> libsVec = cmExpandedList(*runtimeLinkOptions);
    for (std::string const& i : libsVec) {
      if (!cm::contains(this->ImplicitLinkLibs, i)) {
        this->AddItem({ i });
      }
    }
  }
}